

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TikzPlotter.cpp
# Opt level: O3

void __thiscall
vectorgraphics::TikzPlotter::addLineSegment(TikzPlotter *this,LineSegment2D *line_segment_2d)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer psVar3;
  Style *this_00;
  TikzPlotter *this_01;
  bool bVar4;
  iterator iVar5;
  ostream *poVar6;
  shared_ptr<vectorgraphics::Style> *style_ptr;
  pointer psVar7;
  long lVar8;
  long *plVar9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  StyleMap style_map;
  allocator_type local_1c1;
  LineSegment2D *local_1c0;
  key_type local_1b8;
  TikzPlotter *local_198;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_190;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_178;
  key_type local_148;
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  long *local_68 [2];
  long local_58 [2];
  vector<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
  local_48;
  
  local_178._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_178._M_impl.super__Rb_tree_header._M_header;
  local_178._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_178._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_178._M_impl.super__Rb_tree_header._M_node_count = 0;
  psVar7 = (line_segment_2d->super_Primitive).style_ptrs.
           super__Vector_base<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (line_segment_2d->super_Primitive).style_ptrs.
           super__Vector_base<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1c0 = line_segment_2d;
  local_198 = this;
  local_178._M_impl.super__Rb_tree_header._M_header._M_right =
       local_178._M_impl.super__Rb_tree_header._M_header._M_left;
  if (psVar7 != psVar3) {
    do {
      this_00 = (psVar7->super___shared_ptr<vectorgraphics::Style,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
      std::
      vector<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
      ::vector(&local_48,
               (vector<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
                *)local_1c0);
      bVar4 = Style::conditionFulfilled(this_00,&local_48);
      std::
      vector<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
      ::~vector(&local_48);
      if (bVar4) {
        Style::applyStyle((psVar7->
                          super___shared_ptr<vectorgraphics::Style,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr,(StyleMap *)&local_178);
      }
      psVar7 = psVar7 + 1;
    } while (psVar7 != psVar3);
  }
  paVar2 = &local_148.field_2;
  local_148._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"draw","");
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&local_178,&local_148);
  p_Var1 = &local_178._M_impl.super__Rb_tree_header;
  bVar4 = true;
  if ((_Rb_tree_header *)iVar5._M_node == p_Var1) {
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"fill","");
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&local_178,&local_1b8);
    bVar4 = (_Rb_tree_header *)iVar5._M_node != p_Var1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
  }
  this_01 = local_198;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != paVar2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this_01->field_0x10,"\\path[",6);
    local_148._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"draw","");
    local_128[0] = local_118;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"draw opacity","");
    local_108[0] = local_f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"fill","");
    local_e8[0] = local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"fill opacity","");
    local_c8[0] = local_b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"line width","");
    local_a8[0] = local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"line cap","");
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"dash pattern","");
    plVar9 = local_58;
    local_68[0] = plVar9;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"*line_path","");
    __l._M_len = 8;
    __l._M_array = &local_148;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_190,__l,&local_1c1);
    getStyleMapString(&local_1b8,(StyleMap *)&local_178,&local_190);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&this_01->field_0x10,local_1b8._M_dataplus._M_p,
                        local_1b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] ",2);
    poVar6 = operator<<(poVar6,(local_1c0->start_ptr_).
                               super___shared_ptr<vectorgraphics::Point2D,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," -- ",4);
    poVar6 = operator<<(poVar6,(local_1c0->end_ptr_).
                               super___shared_ptr<vectorgraphics::Point2D,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,";",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_190);
    lVar8 = -0x100;
    do {
      if (plVar9 != (long *)plVar9[-2]) {
        operator_delete((long *)plVar9[-2],*plVar9 + 1);
      }
      plVar9 = plVar9 + -4;
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0);
  }
  addPoint(this_01,(local_1c0->start_ptr_).
                   super___shared_ptr<vectorgraphics::Point2D,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  addPoint(this_01,(local_1c0->end_ptr_).
                   super___shared_ptr<vectorgraphics::Point2D,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_178);
  return;
}

Assistant:

void TikzPlotter::addLineSegment(const LineSegment2D &line_segment_2d) {
    // first add the line
    StyleMap style_map;

    // check which styles apply
    for(const auto& style_ptr : line_segment_2d.style_ptrs) {
      if(style_ptr->conditionFulfilled(line_segment_2d.flag_ptrs)) {
        style_ptr->applyStyle(style_map);
      }
    }

    // add the line based on style_map final state
    if(style_map.find("draw") != style_map.end() || style_map.find("fill") != style_map.end()) {
      content << R"(\path[)" 
        << getStyleMapString(style_map, {"draw", "draw opacity", "fill", "fill opacity", "line width", "line cap", "dash pattern", "*line_path"})
        << "] " 
        << *line_segment_2d.start_ptr_ 
        << " -- " 
        << *line_segment_2d.end_ptr_
        << ";"
        << std::endl;
    }

    // next add the endpoints
    addPoint(*line_segment_2d.start_ptr_);
    addPoint(*line_segment_2d.end_ptr_);
  }